

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

int cmSystemTools::strverscmp(char *__s1,char *__s2)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  
  lVar5 = *(long *)__s1;
  lVar6 = *(long *)__s2;
  uVar10 = 0xfffffffffffffffe;
  do {
    uVar9 = uVar10;
    cVar3 = *(char *)(lVar5 + 2 + uVar9);
    cVar4 = *(char *)(lVar6 + 2 + uVar9);
    uVar10 = uVar9 + 1;
    if (cVar3 == '\0') break;
  } while (cVar3 == cVar4);
  if (cVar3 != cVar4) {
    if (uVar10 != 0xffffffffffffffff) {
      lVar12 = uVar9 + 2;
      do {
        if (9 < (int)*(char *)(lVar5 + -1 + lVar12) - 0x30U) goto LAB_00313ba1;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    lVar12 = 0;
LAB_00313ba1:
    if ((uVar10 - lVar12 != -1) || (((int)cVar3 - 0x30U < 10 && ((int)cVar4 - 0x30U < 10)))) {
      uVar13 = (uint)*(byte *)(lVar5 + lVar12);
      uVar7 = 0;
      do {
        uVar11 = uVar7;
        if ((char)uVar13 != '0') break;
        uVar13 = (uint)(char)((byte *)(lVar5 + lVar12))[uVar11 + 1];
        uVar7 = uVar11 + 1;
      } while (uVar13 - 0x30 < 10);
      uVar13 = (uint)*(byte *)(lVar12 + lVar6);
      uVar7 = 0;
      uVar8 = uVar11;
      do {
        uVar15 = uVar8;
        uVar14 = uVar7;
        if ((char)uVar13 != '0') break;
        uVar13 = (uint)(char)((byte *)(lVar12 + lVar6))[uVar14 + 1];
        uVar7 = uVar14 + 1;
        uVar8 = uVar15 - 1;
      } while (uVar13 - 0x30 < 10);
      if (uVar15 != 0) {
        return (uVar11 < uVar14) - 1 | 1;
      }
      if (uVar11 == 0) {
        lVar12 = 0;
        do {
          lVar1 = lVar5 + lVar12;
          lVar12 = lVar12 + 1;
        } while ((int)*(char *)(uVar9 + 2 + lVar1) - 0x30U < 10);
        uVar9 = uVar10 + lVar12;
        do {
          pcVar2 = (char *)(lVar6 + 1 + uVar10);
          uVar10 = uVar10 + 1;
          lVar12 = lVar12 + -1;
        } while ((int)*pcVar2 - 0x30U < 10);
        if (lVar12 != 0) {
          return (uVar10 < uVar9) - 1 | 1;
        }
      }
    }
  }
  return (int)cVar3 - (int)cVar4;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = "[";
    reg += key + "]";
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}